

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,BranchIf *b)

{
  bool bVar1;
  Expression *e;
  CodePrinter *pCVar2;
  Block *pBVar3;
  Block *b_00;
  Block *b_01;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> local_88;
  string local_78;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> local_58 [2];
  string local_38;
  BranchIf *local_18;
  BranchIf *b_local;
  PrinterStream *this_local;
  
  local_18 = b;
  b_local = (BranchIf *)this;
  choc::text::CodePrinter::operator<<(this->out,"branch_if ");
  e = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18->condition);
  printExpression(this,e);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," ? ");
  pBVar3 = pool_ref::operator_cast_to_Block_((pool_ref *)local_18->targets);
  getBlockName_abi_cxx11_(&local_38,(PrinterStream *)pBVar3,b_00);
  choc::text::CodePrinter::operator<<(pCVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::empty
                    (local_18->targetArgs);
  if (!bVar1) {
    ArrayView<soul::pool_ref<soul::heart::Expression>>::
    ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayView<soul::pool_ref<soul::heart::Expression>> *)local_58,local_18->targetArgs);
    printArgList(this,local_58);
  }
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," : ");
  pBVar3 = pool_ref::operator_cast_to_Block_((pool_ref *)(local_18->targets + 1));
  getBlockName_abi_cxx11_(&local_78,(PrinterStream *)pBVar3,b_01);
  choc::text::CodePrinter::operator<<(pCVar2,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::empty
                    (local_18->targetArgs + 1);
  if (!bVar1) {
    ArrayView<soul::pool_ref<soul::heart::Expression>>::
    ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayView<soul::pool_ref<soul::heart::Expression>> *)&local_88,
               local_18->targetArgs + 1);
    printArgList(this,&local_88);
  }
  return;
}

Assistant:

void printDescription (const heart::BranchIf& b)
        {
            out << "branch_if ";
            printExpression (b.condition);
            out << " ? " << getBlockName (b.targets[0]);

            if (! b.targetArgs[0].empty())
                printArgList (b.targetArgs[0]);

            out << " : " << getBlockName (b.targets[1]);

            if (! b.targetArgs[1].empty())
                printArgList (b.targetArgs[1]);
        }